

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fileHasMoved(unixFile *pFile)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  undefined1 auStack_a8 [8];
  u64 local_a0;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (pFile->pInode == (unixInodeInfo *)0x0) {
    uVar2 = 0;
  }
  else {
    memset(auStack_a8,0xaa,0x90);
    iVar1 = (*aSyscall[4].pCurrent)(pFile->zPath,auStack_a8);
    uVar2 = 1;
    if (iVar1 == 0) {
      uVar2 = (uint)(local_a0 != (pFile->pInode->fileId).ino);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int fileHasMoved(unixFile *pFile){
#if OS_VXWORKS
  return pFile->pInode!=0 && pFile->pId!=pFile->pInode->fileId.pId;
#else
  struct stat buf;
  return pFile->pInode!=0 &&
      (osStat(pFile->zPath, &buf)!=0
         || (u64)buf.st_ino!=pFile->pInode->fileId.ino);
#endif
}